

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::SequenceFeatureType::SequenceFeatureType
          (SequenceFeatureType *this,SequenceFeatureType *from)

{
  void *pvVar1;
  SizeRange *from_00;
  SizeRange *this_00;
  Int64FeatureType *this_01;
  Int64FeatureType *from_01;
  StringFeatureType *this_02;
  StringFeatureType *from_02;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__SequenceFeatureType_00392fa8;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  from_00 = from->sizerange_;
  if (from_00 == (SizeRange *)0x0 ||
      from == (SequenceFeatureType *)&_SequenceFeatureType_default_instance_) {
    this_00 = (SizeRange *)0x0;
  }
  else {
    this_00 = (SizeRange *)operator_new(0x28);
    SizeRange::SizeRange(this_00,from_00);
  }
  this->sizerange_ = this_00;
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 3) {
    this_02 = mutable_stringtype(this);
    from_02 = stringtype(from);
    StringFeatureType::MergeFrom(this_02,from_02);
  }
  else if (from->_oneof_case_[0] == 1) {
    this_01 = mutable_int64type(this);
    from_01 = int64type(from);
    Int64FeatureType::MergeFrom(this_01,from_01);
  }
  return;
}

Assistant:

SequenceFeatureType::SequenceFeatureType(const SequenceFeatureType& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_sizerange()) {
    sizerange_ = new ::CoreML::Specification::SizeRange(*from.sizerange_);
  } else {
    sizerange_ = NULL;
  }
  clear_has_Type();
  switch (from.Type_case()) {
    case kInt64Type: {
      mutable_int64type()->::CoreML::Specification::Int64FeatureType::MergeFrom(from.int64type());
      break;
    }
    case kStringType: {
      mutable_stringtype()->::CoreML::Specification::StringFeatureType::MergeFrom(from.stringtype());
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.SequenceFeatureType)
}